

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

ExpressionValue *
expLabelFuncHeaderSize
          (ExpressionValue *__return_storage_ptr__,Identifier *funcName,
          vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *parameters)

{
  bool bVar1;
  size_type sVar2;
  __shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2> *this;
  element_type *this_00;
  Identifier *args_1;
  int64_t iVar3;
  int64_t iVar4;
  Label *label;
  vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_> *parameters_local;
  Identifier *funcName_local;
  
  sVar2 = std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::size
                    (parameters);
  if (sVar2 == 0) {
    bVar1 = FileManager::hasOpenFile(g_fileManager);
    if (bVar1) {
      iVar3 = FileManager::getHeaderSize(g_fileManager);
      ExpressionValue::ExpressionValue(__return_storage_ptr__,iVar3);
    }
    else {
      Logger::queueError<>(Error,"headersize: no file opened");
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
  }
  else {
    this = &std::vector<std::shared_ptr<Label>,_std::allocator<std::shared_ptr<Label>_>_>::front
                      (parameters)->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>;
    this_00 = std::__shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>::get(this);
    if (this_00 == (element_type *)0x0) {
      ExpressionValue::ExpressionValue(__return_storage_ptr__);
    }
    else {
      bVar1 = Label::hasPhysicalValue(this_00);
      if (bVar1) {
        iVar3 = Label::getValue(this_00);
        iVar4 = Label::getPhysicalValue(this_00);
        ExpressionValue::ExpressionValue(__return_storage_ptr__,iVar3 - iVar4);
      }
      else {
        args_1 = Label::getName(this_00);
        Logger::queueError<Identifier,Identifier>
                  (Error,"%s: parameter %s has no physical address",funcName,args_1);
        ExpressionValue::ExpressionValue(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue expLabelFuncHeaderSize(const Identifier &funcName, const std::vector<std::shared_ptr<Label>>& parameters)
{
	// return difference between physical and virtual address of label parameter
	if (parameters.size())
	{
		Label* label = parameters.front().get();
		if (!label)
			return ExpressionValue();

		if (!label->hasPhysicalValue())
		{
			Logger::queueError(Logger::Error, "%s: parameter %s has no physical address", funcName, label->getName());
			return ExpressionValue();
		}

		return ExpressionValue(label->getValue() - label->getPhysicalValue());
	}

	if(!g_fileManager->hasOpenFile())
	{
		Logger::queueError(Logger::Error, "headersize: no file opened");
		return ExpressionValue();
	}
	return ExpressionValue(g_fileManager->getHeaderSize());
}